

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O1

int __thiscall
TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_>::ClassId
          (TPZDohrPrecond<double,_TPZDohrSubstructCondense<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_490;
  TPZDohrSubstructCondense<double> local_470;
  
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"TPZDohrPrecond","");
  uVar1 = Hash(&local_490);
  iVar2 = TPZMatrix<double>::ClassId(&this->super_TPZMatrix<double>);
  TPZDohrSubstructCondense<double>::TPZDohrSubstructCondense(&local_470);
  iVar3 = TPZDohrSubstructCondense<double>::ClassId(&local_470);
  TPZDohrSubstructCondense<double>::~TPZDohrSubstructCondense(&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}